

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_putrid_air(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *ch_00;
  
  if (ch->in_room->sector_type == 8) {
    send_to_char("You cannot cast this here.\n\r",ch);
    return;
  }
  act("A wave of putrid air sweeps through the area!",ch,(void *)0x0,(void *)0x0,4);
  pCVar1 = ch->in_room->people;
LAB_0035ef62:
  do {
    do {
      ch_00 = pCVar1;
      if (ch_00 == (CHAR_DATA *)0x0) {
        return;
      }
      pCVar1 = ch_00->next_in_room;
      bVar2 = is_affected(ch_00,(int)gsn_ultradiffusion);
    } while (bVar2);
    bVar2 = is_npc(ch_00);
    if (!bVar2) goto LAB_0035efa4;
  } while ((ch_00 == ch) || ((ch_00->form[0] & 0x1000U) == 0));
  goto LAB_0035efa9;
LAB_0035efa4:
  if (ch_00 != ch) {
LAB_0035efa9:
    iVar3 = number_percent();
    iVar4 = get_curr_stat(ch_00,4);
    if (iVar4 * 10 + -0x96 < iVar3) {
      do_visible(ch_00,"");
      act("You burst out in a fit of coughing.",ch_00,(void *)0x0,(void *)0x0,3);
      act("$n bursts out in a fit of coughing.",ch_00,(void *)0x0,(void *)0x0,0);
    }
  }
  goto LAB_0035ef62;
}

Assistant:

void spell_putrid_air(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch, *vch_next;

	if (ch->in_room->sector_type && ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast this here.\n\r", ch);
		return;
	}

	act("A wave of putrid air sweeps through the area!", ch, 0, 0, TO_ALL);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_affected(vch, gsn_ultradiffusion))
			continue;

		if (is_npc(vch) && !IS_SET(vch->form, FORM_BIPED))
			continue;

		if (vch == ch)
			continue;

		if (number_percent() > 10 * (get_curr_stat(vch, STAT_CON) - 15))
		{
			do_visible(vch, "");
			act("You burst out in a fit of coughing.", vch, nullptr, nullptr, TO_CHAR);
			act("$n bursts out in a fit of coughing.", vch, nullptr, nullptr, TO_ROOM);
		}
	}
}